

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O0

void __thiscall
priorityQueueTest_crossing_data_Test::TestBody(priorityQueueTest_crossing_data_Test *this)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  T *pTVar4;
  char *pcVar5;
  AssertHelper local_190;
  Message local_188;
  int local_17c;
  size_type local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  int local_14c;
  size_t local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  Message local_108;
  size_t local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  size_t local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  double local_80;
  double local_78 [3];
  double local_60;
  int local_54;
  undefined1 local_50 [4];
  int i;
  Priority_queue pq;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  priorityQueueTest_crossing_data_Test *this_local;
  
  std::priority_queue<double,std::vector<double,std::allocator<double>>,std::less<double>>::
  priority_queue<std::vector<double,std::allocator<double>>,void>
            ((priority_queue<double,std::vector<double,std::allocator<double>>,std::less<double>> *)
             &pq.currentsize);
  Priority_queue::Priority_queue((Priority_queue *)local_50);
  for (local_54 = 0; local_54 != 100000; local_54 = local_54 + 1) {
    local_60 = (double)local_54;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> *
         )&pq.currentsize,&local_60);
    local_78[0] = (double)local_54;
    Priority_queue::push((Priority_queue *)local_50,local_78);
    local_80 = (double)-local_54;
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> *
         )&pq.currentsize,&local_80);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(double)-local_54;
    Priority_queue::push((Priority_queue *)local_50,(T *)&gtest_ar.message_);
    pvVar3 = std::
             priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
             ::top((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                    *)&pq.currentsize);
    dVar1 = *pvVar3;
    pTVar4 = Priority_queue::top((Priority_queue *)local_50);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_98,"std_pq.top()","pq.top()",dVar1,*pTVar4);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x7b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0014dc19;
    local_c8 = std::
               priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
               ::size((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                       *)&pq.currentsize);
    local_d0 = Priority_queue::size((Priority_queue *)local_50);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_c0,"std_pq.size()","pq.size()",&local_c8,&local_d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x7c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_d8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0014dc19;
  }
  local_f8 = std::
             priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
             ::size((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                     *)&pq.currentsize);
  local_100 = Priority_queue::size((Priority_queue *)local_50);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_f0,"std_pq.size()","pq.size()",&local_f8,&local_100);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_108);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x7e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_108);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    while (bVar2 = Priority_queue::empty((Priority_queue *)local_50), ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
               ::top((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                      *)&pq.currentsize);
      dVar1 = *pvVar3;
      pTVar4 = Priority_queue::top((Priority_queue *)local_50);
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_120,"std_pq.top()","pq.top()",dVar1,*pTVar4);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar2) {
        testing::Message::Message(&local_128);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                   ,0x80,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_128);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0014dc19;
      std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
      ::pop((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
             *)&pq.currentsize);
      Priority_queue::pop((Priority_queue *)local_50);
    }
    local_148 = Priority_queue::size((Priority_queue *)local_50);
    local_14c = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_140,"pq.size()","0",&local_148,&local_14c);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar2) {
      testing::Message::Message(&local_158);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x84,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_158);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_178 = std::
                  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                  ::size((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                          *)&pq.currentsize);
      local_17c = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_170,"std_pq.size()","0",&local_178,&local_17c);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar2) {
        testing::Message::Message(&local_188);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                   ,0x85,pcVar5);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message(&local_188);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        gtest_ar_1.message_.ptr_._4_4_ = 0;
      }
    }
  }
LAB_0014dc19:
  Priority_queue::~Priority_queue((Priority_queue *)local_50);
  std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
  ~priority_queue((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                   *)&pq.currentsize);
  return;
}

Assistant:

TEST_F(priorityQueueTest, crossing_data) {
    std::priority_queue<double> std_pq;
    Priority_queue pq;
    for (int i = 0; i != 100000; ++i) {
        std_pq.push((double) i);
        pq.push((double) i);
        std_pq.push((double) -i);
        pq.push((double) -i);
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        ASSERT_EQ(std_pq.size(), pq.size());
    }
    ASSERT_EQ(std_pq.size(), pq.size());
    while (!pq.empty()) {
        ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
        std_pq.pop();
        pq.pop();
    }
    ASSERT_EQ(pq.size(), 0);
    ASSERT_EQ(std_pq.size(), 0);
}